

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

QByteArray * QTimeZone::systemTimeZoneId(void)

{
  Type *pTVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *this;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)&local_38
  ;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
           operator->(in_RDI);
  (*((pTVar1->backend).d.ptr)->_vptr_QTimeZonePrivate[0x13])();
  if (local_28 == (undefined1 *)0x0) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
             operator->(this);
    QTimeZonePrivate::id((pTVar1->backend).d.ptr);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,1,0x10);
      }
    }
  }
  else {
    *(QArrayData **)in_RDI = local_38;
    *(undefined1 **)(in_RDI + 8) = puStack_30;
    *(undefined1 **)(in_RDI + 0x10) = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZone::systemTimeZoneId()
{
    QByteArray sys = global_tz->backend->systemTimeZoneId();
    if (!sys.isEmpty())
        return sys;
    // The system zone, despite the empty ID, may know its real ID anyway:
    return global_tz->backend->id();
}